

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_main.cpp
# Opt level: O1

FString __thiscall Stat_fps_accumulated::GetStats(Stat_fps_accumulated *this)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar2 = FrameCycles.Sec * 1000.0 + f_acc;
  dVar3 = WallCycles.Sec * 1000.0 + w_acc;
  dVar4 = PlaneCycles.Sec * 1000.0 + p_acc;
  dVar6 = MaskedCycles.Sec * 1000.0 + m_acc;
  iVar1 = acc_c + 1;
  f_acc = dVar2;
  w_acc = dVar3;
  p_acc = dVar4;
  m_acc = dVar6;
  acc_c = iVar1;
  (this->super_FStat)._vptr_FStat = (_func_int **)0x87e02c;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  dVar5 = 1.0 / (double)iVar1;
  FString::Format((FString *)this,
                  "frame=%04.1f ms  walls=%04.1f ms  planes=%04.1f ms  masked=%04.1f ms  %d counts",
                  dVar2 * dVar5,dVar3 * dVar5,dVar4 * dVar5,dVar5 * dVar6);
  Printf(5,"%s\n",(this->super_FStat)._vptr_FStat);
  return (FString)(char *)this;
}

Assistant:

ADD_STAT (fps_accumulated)
{
	f_acc += FrameCycles.TimeMS();
	w_acc += WallCycles.TimeMS();
	p_acc += PlaneCycles.TimeMS();
	m_acc += MaskedCycles.TimeMS();
	acc_c++;
	FString out;
	out.Format("frame=%04.1f ms  walls=%04.1f ms  planes=%04.1f ms  masked=%04.1f ms  %d counts",
		f_acc/acc_c, w_acc/acc_c, p_acc/acc_c, m_acc/acc_c, acc_c);
	Printf(PRINT_LOG, "%s\n", out.GetChars());
	return out;
}